

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal.cpp
# Opt level: O3

void __thiscall clickhouse::ColumnDecimal::Append(ColumnDecimal *this,Int128 *value)

{
  element_type *peVar1;
  Type *pTVar2;
  Code CVar3;
  ColumnVector<int> *pCVar4;
  ColumnVector<long> *pCVar5;
  ColumnVector<absl::int128> *pCVar6;
  enable_shared_from_this<clickhouse::Column> *__r;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  ColumnVector<int> *pCVar8;
  ColumnVector<long> *pCVar9;
  ColumnVector<absl::int128> *pCVar10;
  undefined1 local_38 [24];
  
  peVar1 = (this->data_).super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pTVar2 = (peVar1->type_).super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var7 = (peVar1->type_).super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
    }
  }
  CVar3 = Type::GetCode(pTVar2);
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
  }
  peVar1 = (this->data_).super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (CVar3 == Int32) {
    std::__shared_ptr<clickhouse::Column,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<clickhouse::Column,void>
              ((__shared_ptr<clickhouse::Column,(__gnu_cxx::_Lock_policy)2> *)local_38,
               (__weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2> *)
               &peVar1->super_enable_shared_from_this<clickhouse::Column>);
    if (local_38._0_8_ == 0) {
      p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      pCVar8 = (ColumnVector<int> *)0x0;
    }
    else {
      pCVar4 = (ColumnVector<int> *)
               __dynamic_cast(local_38._0_8_,&Column::typeinfo,&ColumnVector<int>::typeinfo,0);
      p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      pCVar8 = (ColumnVector<int> *)0x0;
      if (pCVar4 != (ColumnVector<int> *)0x0) {
        pCVar8 = pCVar4;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_ ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        else {
          p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_;
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(local_38._8_8_ + 8) = *(_Atomic_word *)(local_38._8_8_ + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(local_38._8_8_ + 8) = *(_Atomic_word *)(local_38._8_8_ + 8) + 1;
          }
        }
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_);
    }
    local_38._0_4_ = (int)value->v_;
    ColumnVector<int>::Append(pCVar8,(int *)local_38);
  }
  else {
    pTVar2 = (peVar1->type_).super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    p_Var7 = (peVar1->type_).super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      }
    }
    CVar3 = Type::GetCode(pTVar2);
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
    }
    __r = &((this->data_).super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
           ->super_enable_shared_from_this<clickhouse::Column>;
    if (CVar3 == Int64) {
      std::__shared_ptr<clickhouse::Column,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<clickhouse::Column,void>
                ((__shared_ptr<clickhouse::Column,(__gnu_cxx::_Lock_policy)2> *)local_38,
                 (__weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2> *)__r);
      if (local_38._0_8_ == 0) {
        p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        pCVar9 = (ColumnVector<long> *)0x0;
      }
      else {
        pCVar5 = (ColumnVector<long> *)
                 __dynamic_cast(local_38._0_8_,&Column::typeinfo,&ColumnVector<long>::typeinfo,0);
        p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        pCVar9 = (ColumnVector<long> *)0x0;
        if (pCVar5 != (ColumnVector<long> *)0x0) {
          pCVar9 = pCVar5;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_ ==
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          else {
            p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_;
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)(local_38._8_8_ + 8) = *(_Atomic_word *)(local_38._8_8_ + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)(local_38._8_8_ + 8) = *(_Atomic_word *)(local_38._8_8_ + 8) + 1;
            }
          }
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_);
      }
      local_38._0_8_ = (undefined8)value->v_;
      ColumnVector<long>::Append(pCVar9,(long *)local_38);
    }
    else {
      std::__shared_ptr<clickhouse::Column,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<clickhouse::Column,void>
                ((__shared_ptr<clickhouse::Column,(__gnu_cxx::_Lock_policy)2> *)local_38,
                 (__weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2> *)__r);
      if (local_38._0_8_ == 0) {
        p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        pCVar10 = (ColumnVector<absl::int128> *)0x0;
      }
      else {
        pCVar6 = (ColumnVector<absl::int128> *)
                 __dynamic_cast(local_38._0_8_,&Column::typeinfo,
                                &ColumnVector<absl::int128>::typeinfo,0);
        p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        pCVar10 = (ColumnVector<absl::int128> *)0x0;
        if (pCVar6 != (ColumnVector<absl::int128> *)0x0) {
          pCVar10 = pCVar6;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_ ==
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          else {
            p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_;
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)(local_38._8_8_ + 8) = *(_Atomic_word *)(local_38._8_8_ + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)(local_38._8_8_ + 8) = *(_Atomic_word *)(local_38._8_8_ + 8) + 1;
            }
          }
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_);
      }
      local_38._0_8_ = (undefined8)value->v_;
      local_38._8_8_ = *(undefined8 *)((long)&value->v_ + 8);
      ColumnVector<absl::int128>::Append(pCVar10,(int128 *)local_38);
    }
  }
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
  }
  return;
}

Assistant:

void ColumnDecimal::Append(const Int128& value) {
    if (data_->Type()->GetCode() == Type::Int32) {
        data_->As<ColumnInt32>()->Append(static_cast<ColumnInt32::DataType>(value));
    } else if (data_->Type()->GetCode() == Type::Int64) {
        data_->As<ColumnInt64>()->Append(static_cast<ColumnInt64::DataType>(value));
    } else {
        data_->As<ColumnInt128>()->Append(static_cast<ColumnInt128::DataType>(value));
    }
}